

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void set_sgb_palette(Emulator *e,int pal,u8 lo0,u8 hi0,u8 lo1,u8 hi1,u8 lo2,u8 hi2,u8 lo3,u8 hi3)

{
  PaletteRGBA *pPVar1;
  undefined8 uVar2;
  RGBA RVar3;
  long lVar4;
  
  pPVar1 = (e->state).sgb.screen_pal;
  for (lVar4 = 0x33464; lVar4 != 0x334a4; lVar4 = lVar4 + 0x10) {
    RVar3 = unpack_cgb_color8(e,lo0,hi0);
    *(RGBA *)((long)(e->config).disable_sound + lVar4) = RVar3;
  }
  RVar3 = unpack_cgb_color8(e,lo1,hi1);
  (e->state).sgb.screen_pal[pal].color[1] = RVar3;
  RVar3 = unpack_cgb_color8(e,lo2,hi2);
  (e->state).sgb.screen_pal[pal].color[2] = RVar3;
  RVar3 = unpack_cgb_color8(e,lo3,hi3);
  (e->state).sgb.screen_pal[pal].color[3] = RVar3;
  if (pal == 0) {
    uVar2 = *(undefined8 *)((e->state).sgb.screen_pal[0].color + 2);
    *(undefined8 *)e->color_to_rgba[1].color = *(undefined8 *)pPVar1->color;
    *(undefined8 *)(e->color_to_rgba[1].color + 2) = uVar2;
    update_bw_palette_rgba(e,PALETTE_TYPE_OBP0);
    uVar2 = *(undefined8 *)((e->state).sgb.screen_pal[0].color + 2);
    *(undefined8 *)e->color_to_rgba[2].color = *(undefined8 *)pPVar1->color;
    *(undefined8 *)(e->color_to_rgba[2].color + 2) = uVar2;
    update_bw_palette_rgba(e,PALETTE_TYPE_OBP1);
  }
  update_bw_palette_rgba(e,PALETTE_TYPE_BGP);
  return;
}

Assistant:

static void set_sgb_palette(Emulator* e, int pal, u8 lo0, u8 hi0, u8 lo1,
                               u8 hi1, u8 lo2, u8 hi2, u8 lo3, u8 hi3) {
  for (int i = 0; i < 4; ++i) {
    SGB.screen_pal[i].color[0] = unpack_cgb_color8(e, lo0, hi0);
  }
  SGB.screen_pal[pal].color[1] = unpack_cgb_color8(e, lo1, hi1);
  SGB.screen_pal[pal].color[2] = unpack_cgb_color8(e, lo2, hi2);
  SGB.screen_pal[pal].color[3] = unpack_cgb_color8(e, lo3, hi3);
  if (pal == 0) {
    emulator_set_bw_palette(e, PALETTE_TYPE_OBP0, &SGB.screen_pal[0]);
    emulator_set_bw_palette(e, PALETTE_TYPE_OBP1, &SGB.screen_pal[0]);
  }
  update_bw_palette_rgba(e, PALETTE_TYPE_BGP);
}